

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_faceForward_vec4(ShaderEvalContext *c)

{
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  undefined8 local_20;
  undefined8 local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle(&local_30,(int)c + 0x30,1,2,3);
  tcu::Vector<float,_4>::swizzle(&local_40,(int)local_10 + 0x40,3,2,1);
  tcu::Vector<float,_4>::swizzle(&local_50,(int)local_10 + 0x50,0,3,2);
  tcu::faceForward<float,4>((tcu *)&local_20,&local_30,&local_40,&local_50);
  *(undefined8 *)(local_10->color).m_data = local_20;
  *(undefined8 *)((local_10->color).m_data + 2) = local_18;
  return;
}

Assistant:

void eval_refract_float	(ShaderEvalContext& c) { c.color.x()	= refract(c.in[0].z(),                 c.in[1].x(),                 c.in[2].y()); }